

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::Own<kj::AsyncIoStream>_> __thiscall
kj::Promise<kj::Own<kj::AsyncIoStream>>::attach<kj::Own<kj::ConnectionReceiver>>
          (Promise<kj::Own<kj::AsyncIoStream>> *this,Own<kj::ConnectionReceiver> *attachments)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::ConnectionReceiver> *params_00;
  NoInfer<kj::Own<kj::ConnectionReceiver>_> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::Own<kj::AsyncIoStream>_> PVar1;
  Own<kj::ConnectionReceiver> local_50;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::ConnectionReceiver>_>_> local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<kj::Own<kj::ConnectionReceiver>_> *local_20;
  Own<kj::ConnectionReceiver> *attachments_local;
  Promise<kj::Own<kj::AsyncIoStream>_> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = (Promise<kj::Own<kj::AsyncIoStream>_> *)this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  params_00 = fwd<kj::Own<kj::ConnectionReceiver>>(local_20);
  tuple<kj::Own<kj::ConnectionReceiver>>((kj *)&local_50,params_00);
  heap<kj::_::AttachmentPromiseNode<kj::Own<kj::ConnectionReceiver>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::ConnectionReceiver>>
            ((kj *)&local_40,params,&local_50);
  Own<kj::_::PromiseNode>::Own<kj::_::AttachmentPromiseNode<kj::Own<kj::ConnectionReceiver>>,void>
            (&local_30,&local_40);
  Promise<kj::Own<kj::AsyncIoStream>_>::Promise
            ((Promise<kj::Own<kj::AsyncIoStream>_> *)this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::ConnectionReceiver>_>_>::~Own(&local_40);
  Own<kj::ConnectionReceiver>::~Own(&local_50);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<kj::AsyncIoStream>_>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}